

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::DeathTestImpl::DeathTestImpl(DeathTestImpl *this,char *a_statement,RE *a_regex)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  DeathTest::DeathTest(&this->super_DeathTest);
  *in_RDI = &PTR__DeathTestImpl_0018e6a8;
  in_RDI[1] = in_RSI;
  in_RDI[2] = in_RDX;
  *(undefined1 *)(in_RDI + 3) = 0;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 0xffffffff;
  *(undefined4 *)(in_RDI + 5) = 0xffffffff;
  return;
}

Assistant:

DeathTestImpl(const char* a_statement, const RE* a_regex)
      : statement_(a_statement),
        regex_(a_regex),
        spawned_(false),
        status_(-1),
        outcome_(IN_PROGRESS),
        read_fd_(-1),
        write_fd_(-1) {}